

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64emithelper.cpp
# Opt level: O2

void asmjit::v1_14::a64::assignEmitterFuncs(BaseEmitter *emitter)

{
  (emitter->_funcs).emitProlog = Emitter_emitProlog;
  (emitter->_funcs).emitEpilog = Emitter_emitEpilog;
  (emitter->_funcs).emitArgsAssignment = Emitter_emitArgsAssignment;
  (emitter->_funcs).formatInstruction = FormatterInternal::formatInstruction;
  (emitter->_funcs).validate = InstInternal::validate;
  return;
}

Assistant:

void assignEmitterFuncs(BaseEmitter* emitter) {
  emitter->_funcs.emitProlog = Emitter_emitProlog;
  emitter->_funcs.emitEpilog = Emitter_emitEpilog;
  emitter->_funcs.emitArgsAssignment = Emitter_emitArgsAssignment;

#ifndef ASMJIT_NO_LOGGING
  emitter->_funcs.formatInstruction = FormatterInternal::formatInstruction;
#endif

#ifndef ASMJIT_NO_VALIDATION
  emitter->_funcs.validate = InstInternal::validate;
#endif
}